

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O3

void after_read(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_shutdown_t *req;
  
  if (buf->base != (char *)0x0) {
    free(buf->base);
  }
  req = (uv_shutdown_t *)malloc(0x50);
  iVar1 = uv_shutdown(req,handle,after_shutdown);
  if (iVar1 == 0) {
    return;
  }
  after_read_cold_1();
  uv_close((uv_handle_t *)req->handle,on_close);
  free(req);
  return;
}

Assistant:

static void after_read(uv_stream_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf) {
  uv_shutdown_t* req;
  int r;

  if (buf->base) {
    free(buf->base);
  }

  req = (uv_shutdown_t*) malloc(sizeof *req);
  r = uv_shutdown(req, handle, after_shutdown);
  ASSERT(r == 0);
}